

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

_Bool golf_geo_generator_data_get_arg
                (golf_geo_generator_data_t *data,char *name,golf_geo_generator_data_arg_t **arg)

{
  uint uVar1;
  golf_geo_generator_data_arg_t *pgVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  uVar1 = (data->args).length;
  lVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  lVar6 = 0x58;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar7 == uVar5) goto LAB_00129f76;
    pgVar2 = (data->args).data;
    iVar4 = strcmp(pgVar2->name + lVar8,name);
    lVar6 = lVar6 + -0x58;
    lVar8 = lVar8 + 0x58;
    uVar3 = uVar5 + 1;
  } while (iVar4 != 0);
  *arg = (golf_geo_generator_data_arg_t *)((long)pgVar2 - lVar6);
LAB_00129f76:
  return (long)uVar5 < (long)(int)uVar1;
}

Assistant:

bool golf_geo_generator_data_get_arg(golf_geo_generator_data_t *data, const char *name, golf_geo_generator_data_arg_t **arg) {
    for (int i = 0; i < data->args.length; i++) {
        if (strcmp(data->args.data[i].name, name) == 0) {
            *arg = &data->args.data[i];
            return true;
        }
    }
    return false;
}